

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_print_objects(ggml_context *ctx)

{
  long in_RDI;
  ggml_object *obj;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x18);
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: objects in context %p:\n","ggml_print_objects",in_RDI);
  for (; local_10 != 0; local_10 = *(long *)(local_10 + 0x10)) {
    ggml_print_object((ggml_object *)0x148be8);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: --- end ---\n","ggml_print_objects");
  return;
}

Assistant:

void ggml_print_objects(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    GGML_LOG_INFO("%s: objects in context %p:\n", __func__, (const void *) ctx);

    while (obj != NULL) {
        ggml_print_object(obj);
        obj = obj->next;
    }

    GGML_LOG_INFO("%s: --- end ---\n", __func__);
}